

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *node;
  StandardPropertyCaseItemSyntax *pSVar1;
  Token *unaff_retaddr;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_00000108;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_00000110;
  Token *args_3;
  
  args_3 = (Token *)__child_stack;
  node = deepClone<slang::syntax::ExpressionSyntax>(in_stack_00000110,in_stack_00000108);
  parsing::Token::deepClone((Token *)in_stack_00000110,in_stack_00000108);
  not_null<slang::syntax::PropertyExprSyntax_*>::operator*
            ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x7bf38a);
  deepClone<slang::syntax::PropertyExprSyntax>
            ((PropertyExprSyntax *)node,(BumpAllocator *)__child_stack);
  parsing::Token::deepClone((Token *)in_stack_00000110,in_stack_00000108);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::StandardPropertyCaseItemSyntax,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token,slang::syntax::PropertyExprSyntax&,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,(PropertyExprSyntax *)__fn,
                      args_3);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const StandardPropertyCaseItemSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<StandardPropertyCaseItemSyntax>(
        *deepClone(node.expressions, alloc),
        node.colon.deepClone(alloc),
        *deepClone<PropertyExprSyntax>(*node.expr, alloc),
        node.semi.deepClone(alloc)
    );
}